

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseTrue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<true>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,VWReaderHandler<true> *handler)

{
  Ch *pCVar1;
  BaseState<true> *pBVar2;
  int iVar3;
  undefined4 extraout_var;
  Ch *pCVar4;
  
  pCVar1 = is->src_;
  pCVar4 = pCVar1 + 1;
  is->src_ = pCVar4;
  if (pCVar1[1] == 'r') {
    pCVar4 = pCVar1 + 2;
    is->src_ = pCVar4;
    if (pCVar1[2] == 'u') {
      pCVar4 = pCVar1 + 3;
      is->src_ = pCVar4;
      if (pCVar1[3] == 'e') {
        is->src_ = pCVar1 + 4;
        pBVar2 = (handler->ctx).current_state;
        iVar3 = (*pBVar2->_vptr_BaseState[1])(pBVar2,handler,1);
        if ((BaseState<true> *)CONCAT44(extraout_var,iVar3) != (BaseState<true> *)0x0) {
          (handler->ctx).previous_state = (handler->ctx).current_state;
          (handler->ctx).current_state = (BaseState<true> *)CONCAT44(extraout_var,iVar3);
          return;
        }
        pCVar4 = is->src_;
        pCVar1 = is->head_;
        *(undefined4 *)(this + 0x30) = 0x10;
        *(long *)(this + 0x38) = (long)pCVar4 - (long)pCVar1;
        return;
      }
    }
  }
  pCVar1 = is->head_;
  *(undefined4 *)(this + 0x30) = 3;
  *(long *)(this + 0x38) = (long)pCVar4 - (long)pCVar1;
  return;
}

Assistant:

void ParseTrue(InputStream& is, Handler& handler)
  { RAPIDJSON_ASSERT(is.Peek() == 't');
    is.Take();

    if (RAPIDJSON_LIKELY(Consume(is, 'r') && Consume(is, 'u') && Consume(is, 'e')))
    { if (RAPIDJSON_UNLIKELY(!handler.Bool(true)))
        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
    }
    else
      RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, is.Tell());
  }